

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * linearize_concat_expression(Proc *proc,AstNode *expr)

{
  PtrList *head;
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  uint uVar4;
  Pseudo *pseudo;
  ulong uVar5;
  AstNode *expr_00;
  Pseudo *pPVar6;
  Pseudo *pPVar7;
  long lVar8;
  undefined8 auStack_70 [2];
  undefined1 local_60 [8];
  PtrListIterator niter__;
  
  auStack_70[0] = 0x11830a;
  niter__._16_8_ = allocate_instruction(proc,op_concat,expr->line_number);
  auStack_70[0] = 0x11831d;
  pseudo = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
  auStack_70[0] = 0x11832a;
  uVar4 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr);
  uVar5 = (long)(int)uVar4 * 8 + 0xfU & 0xfffffffffffffff0;
  lVar1 = -0x68 - uVar5;
  lVar2 = lVar1 - uVar5;
  head = (PtrList *)(expr->field_2).function_stmt.function_expr;
  *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x11835a;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_60,head);
  lVar8 = 0;
  while( true ) {
    *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x118366;
    expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_60);
    uVar3 = niter__._16_8_;
    if (expr_00 == (AstNode *)0x0) break;
    *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x118376;
    pPVar6 = linearize_expression(proc,expr_00);
    uVar3 = niter__._16_8_;
    *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x118388;
    pPVar7 = add_instruction_operand(proc,(Instruction *)uVar3,pPVar6);
    *(Pseudo **)((long)auStack_70 + lVar8 + lVar1 + 0x70) = pPVar7;
    *(Pseudo **)((long)auStack_70 + lVar8 + lVar2 + 0x70) = pPVar6;
    lVar8 = lVar8 + 8;
  }
  *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x1183a7;
  add_instruction_target(proc,(Instruction *)uVar3,pseudo);
  *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x1183b2;
  add_instruction(proc,(Instruction *)uVar3);
  for (uVar5 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar5; uVar5 = uVar5 + 1) {
    pPVar6 = *(Pseudo **)((long)auStack_70 + uVar5 * 8 + lVar2 + 0x70);
    *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x1183d6;
    free_temp_pseudo(proc,pPVar6,false);
    pPVar6 = *(Pseudo **)((long)auStack_70 + uVar5 * 8 + lVar1 + 0x70);
    if (pPVar6 != (Pseudo *)0x0) {
      *(undefined8 *)((long)auStack_70 + lVar2 + 0x68) = 0x1183e9;
      free_temp_pseudo(proc,pPVar6,false);
    }
  }
  return pseudo;
}

Assistant:

static Pseudo *linearize_concat_expression(Proc *proc, AstNode *expr)
{
	Instruction *insn = allocate_instruction(proc, op_concat, expr->line_number);
	ravitype_t target_type = expr->string_concatenation_expr.type.type_code;
	Pseudo *target = allocate_temp_pseudo(proc, target_type, true);
	AstNode *n;
	int N = raviX_ptrlist_size((const PtrList *) expr->string_concatenation_expr.expr_list);
	Pseudo **tofreelist = (Pseudo **)alloca( N* sizeof(Pseudo *));
	Pseudo **operands = (Pseudo **)alloca( N * sizeof(Pseudo *));
	int i = 0;
	FOR_EACH_PTR(expr->string_concatenation_expr.expr_list, AstNode, n) {
		Pseudo *operand = linearize_expression(proc, n);
		Pseudo *tofree =  add_instruction_operand(proc, insn, operand);
		tofreelist[i] = tofree;
		operands[i] = operand;
		i++;
	}
	END_FOR_EACH_PTR(n)
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	for (i=0; i < N; i++) {
		Pseudo *op = operands[i];
		free_temp_pseudo(proc, op, false);
		Pseudo *tofree = tofreelist[i];
		if (tofree)
			free_temp_pseudo(proc, tofree, false);
	}
	return target;
}